

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void __thiscall
gl4cts::CopyImage::InvalidAlignmentTest::InvalidAlignmentTest
          (InvalidAlignmentTest *this,Context *context)

{
  pointer *pptVar1;
  uint uVar2;
  GLuint GVar3;
  GLuint GVar4;
  iterator iVar5;
  ulong uVar6;
  ulong uVar7;
  GLuint h_val;
  GLuint *pGVar8;
  GLuint w;
  long lVar9;
  testCase src_test_case;
  testCase dst_test_case;
  testCase local_90;
  testCase local_74;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"invalid_alignment",
             "Test verifies if INVALID_VALUE is generated when CopySubImageData is executed for regions with invalid alignment"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InvalidAlignmentTest_02109748;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = 0;
  do {
    uVar2 = InvalidAlignmentTest(deqp::Context&)::y_vals[uVar6];
    uVar7 = 0;
    local_58 = uVar6;
    do {
      GVar3 = InvalidAlignmentTest(deqp::Context&)::y_vals[uVar7];
      local_48 = uVar7 | local_58;
      uVar6 = 0;
      local_50 = uVar7;
      do {
        pGVar8 = InvalidAlignmentTest(deqp::Context&)::w_vals;
        GVar4 = InvalidAlignmentTest(deqp::Context&)::w_vals[uVar6];
        local_38 = local_48 | uVar6;
        lVar9 = 0;
        local_40 = uVar6;
        do {
          local_90.m_expected_result = 0x501;
          if ((int)local_38 == 0 && (int)lVar9 == 0) {
            local_90.m_expected_result = 0;
          }
          local_90.m_width = *pGVar8;
          local_74.m_src_x = 0;
          local_74.m_src_y = 0;
          local_90.m_dst_x = 0;
          local_90.m_dst_y = 0;
          iVar5._M_current =
               (this->m_test_cases).
               super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_90.m_height = GVar4;
          local_90.m_src_x = uVar2;
          local_90.m_src_y = GVar3;
          local_74.m_height = GVar4;
          local_74.m_width = local_90.m_width;
          local_74.m_dst_x = uVar2;
          local_74.m_dst_y = GVar3;
          local_74.m_expected_result = local_90.m_expected_result;
          if (iVar5._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<gl4cts::CopyImage::InvalidAlignmentTest::testCase,std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>>
            ::_M_realloc_insert<gl4cts::CopyImage::InvalidAlignmentTest::testCase_const&>
                      ((vector<gl4cts::CopyImage::InvalidAlignmentTest::testCase,std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>>
                        *)&this->m_test_cases,iVar5,&local_74);
          }
          else {
            (iVar5._M_current)->m_src_y = (int)((ulong)uVar2 << 0x20);
            (iVar5._M_current)->m_dst_x = (int)(((ulong)uVar2 << 0x20) >> 0x20);
            (iVar5._M_current)->m_dst_y = GVar3;
            (iVar5._M_current)->m_expected_result = local_90.m_expected_result;
            (iVar5._M_current)->m_height = GVar4;
            (iVar5._M_current)->m_width = local_90.m_width;
            (iVar5._M_current)->m_src_x = 0;
            (iVar5._M_current)->m_src_y = 0;
            pptVar1 = &(this->m_test_cases).
                       super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
          }
          iVar5._M_current =
               (this->m_test_cases).
               super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<gl4cts::CopyImage::InvalidAlignmentTest::testCase,std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>>
            ::_M_realloc_insert<gl4cts::CopyImage::InvalidAlignmentTest::testCase_const&>
                      ((vector<gl4cts::CopyImage::InvalidAlignmentTest::testCase,std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>>
                        *)&this->m_test_cases,iVar5,&local_90);
          }
          else {
            (iVar5._M_current)->m_src_y = local_90.m_src_y;
            (iVar5._M_current)->m_dst_x = local_90.m_dst_x;
            (iVar5._M_current)->m_dst_y = local_90.m_dst_y;
            (iVar5._M_current)->m_expected_result = local_90.m_expected_result;
            (iVar5._M_current)->m_height = local_90.m_height;
            (iVar5._M_current)->m_width = local_90.m_width;
            (iVar5._M_current)->m_src_x = local_90.m_src_x;
            (iVar5._M_current)->m_src_y = local_90.m_src_y;
            pptVar1 = &(this->m_test_cases).
                       super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
          }
          lVar9 = lVar9 + 1;
          pGVar8 = pGVar8 + 1;
        } while (lVar9 == 1);
        uVar6 = local_40 + 1;
      } while (local_40 == 0);
      uVar7 = local_50 + 1;
    } while (local_50 == 0);
    uVar6 = local_58 + 1;
  } while (local_58 == 0);
  return;
}

Assistant:

InvalidAlignmentTest::InvalidAlignmentTest(deqp::Context& context)
	: TestCase(context, "invalid_alignment", "Test verifies if INVALID_VALUE is generated when CopySubImageData is "
											 "executed for regions with invalid alignment")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* 16x16x6 are values used by prepareTex16x16x6 */
	static const GLuint invalid_h = 2;
	static const GLuint invalid_w = 2;
	static const GLuint invalid_x = 2;
	static const GLuint invalid_y = 2;
	static const GLuint valid_h   = 4;
	static const GLuint valid_w   = 4;

	static const GLuint h_vals[] = { valid_h, invalid_h };
	static const GLuint w_vals[] = { valid_w, invalid_w };
	static const GLuint x_vals[] = { 0, invalid_x };
	static const GLuint y_vals[] = { 0, invalid_y };

	static const GLuint n_h_vals = sizeof(h_vals) / sizeof(h_vals[0]);
	static const GLuint n_w_vals = sizeof(w_vals) / sizeof(w_vals[0]);
	static const GLuint n_x_vals = sizeof(x_vals) / sizeof(x_vals[0]);
	static const GLuint n_y_vals = sizeof(y_vals) / sizeof(y_vals[0]);

	for (GLuint x = 0; x < n_x_vals; ++x)
	{
		for (GLuint y = 0; y < n_y_vals; ++y)
		{
			for (GLuint h = 0; h < n_h_vals; ++h)
			{
				for (GLuint w = 0; w < n_w_vals; ++w)
				{
					const GLuint h_val = h_vals[h];
					const GLuint w_val = w_vals[w];
					const GLuint x_val = x_vals[x];
					const GLuint y_val = y_vals[y];
					const GLenum res   = ((valid_h == h_val) && (valid_w == w_val) && (0 == x_val) && (0 == y_val)) ?
										   GL_NO_ERROR :
										   GL_INVALID_VALUE;

					testCase dst_test_case = { h_val, w_val, 0, 0, x_val, y_val, res };

					testCase src_test_case = { h_val, w_val, x_val, y_val, 0, 0, res };

					m_test_cases.push_back(dst_test_case);
					m_test_cases.push_back(src_test_case);
				}
			}
		}
	}
}